

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

p_ply_element ply_grow_element(p_ply ply)

{
  p_ply_element ptVar1;
  
  ptVar1 = (p_ply_element)ply_grow_array(ply,&ply->element,&ply->nelements,0x118);
  if (ptVar1 != (p_ply_element)0x0) {
    ptVar1->name[0] = '\0';
    ptVar1->ninstances = 0;
    ptVar1->property = (p_ply_property)0x0;
    ptVar1->nproperties = 0;
  }
  return ptVar1;
}

Assistant:

static p_ply_element ply_grow_element(p_ply ply) {
    p_ply_element element = NULL;
    assert(ply);
    assert(ply->element || ply->nelements == 0);
    assert(!ply->element || ply->nelements > 0);
    element = (p_ply_element) ply_grow_array(ply, (void **) &ply->element,
            &ply->nelements, sizeof(t_ply_element));
    if (!element) return NULL;
    ply_element_init(element);
    return element;
}